

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O1

void __thiscall SourceMapTest::parseMap(SourceMapTest *this,string *sourceMap)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  SourceMapReader *pSVar1;
  SourceMapReader *pSVar2;
  void *local_40 [2];
  long local_30;
  allocator_type local_21;
  
  __first._M_current = (sourceMap->_M_dataplus)._M_p;
  std::vector<char,std::allocator<char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<char,std::allocator<char>> *)local_40,__first,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + sourceMap->_M_string_length),&local_21);
  std::vector<char,_std::allocator<char>_>::_M_move_assign
            (&this->buffer,(vector<char,std::allocator<char>> *)local_40);
  if (local_40[0] != (void *)0x0) {
    operator_delete(local_40[0],local_30 - (long)local_40[0]);
  }
  pSVar2 = (SourceMapReader *)operator_new(0x40);
  pSVar2->buffer = &this->buffer;
  (pSVar2->mappings)._M_len = 0;
  (pSVar2->mappings)._M_str = (char *)0x0;
  pSVar2->pos = 0;
  pSVar2->location = 0;
  pSVar2->file = 0;
  pSVar2->line = 1;
  pSVar2->col = 0;
  pSVar2->symbol = 0;
  pSVar2->hasInfo = false;
  pSVar2->hasSymbol = false;
  pSVar1 = (this->reader)._M_t.
           super___uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>
           ._M_t.
           super__Tuple_impl<0UL,_wasm::SourceMapReader_*,_std::default_delete<wasm::SourceMapReader>_>
           .super__Head_base<0UL,_wasm::SourceMapReader_*,_false>._M_head_impl;
  (this->reader)._M_t.
  super___uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>._M_t.
  super__Tuple_impl<0UL,_wasm::SourceMapReader_*,_std::default_delete<wasm::SourceMapReader>_>.
  super__Head_base<0UL,_wasm::SourceMapReader_*,_false>._M_head_impl = pSVar2;
  if (pSVar1 != (SourceMapReader *)0x0) {
    operator_delete(pSVar1,0x40);
  }
  ::wasm::SourceMapReader::parse
            ((Module *)
             (this->reader)._M_t.
             super___uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::SourceMapReader_*,_std::default_delete<wasm::SourceMapReader>_>
             .super__Head_base<0UL,_wasm::SourceMapReader_*,_false>._M_head_impl);
  return;
}

Assistant:

void parseMap(std::string& sourceMap) {
    buffer = {sourceMap.begin(), sourceMap.end()};
    reader.reset(new SourceMapReader(buffer));
    reader->parse(wasm);
  }